

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_0::Visitor<__int128>::Visit
          (Visitor<__int128> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  _func_int *p_Var1;
  long lVar2;
  ulong __n;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  OperatorDefinition *pOVar6;
  pointer psVar7;
  size_type sVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  ostream *poVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  shared_ptr<const_calc4::Operator> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  ostream *local_108;
  basic_ostream<char,_std::char_traits<char>_> *local_100;
  ostream *local_f8;
  ostream *local_f0;
  ostream *local_e8;
  ostream *local_e0;
  ostream *local_d8;
  ostream *local_d0;
  ostream *local_c8;
  int local_bc;
  bool local_b5;
  int local_b4;
  ulong local_b0;
  Visitor<__int128> *local_a8;
  optional<int> local_9c;
  VariableName local_94;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  size_t i_2;
  undefined4 local_7c;
  string_view local_70;
  VariableName local_5c;
  ArgumentName local_58;
  int local_54;
  undefined1 local_4f;
  _Optional_payload_base<bool> local_4e;
  int i_1;
  ulong local_40;
  size_t i;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  int *operandVariableNos;
  shared_ptr<const_calc4::UserDefinedOperator> *op_local;
  Visitor<__int128> *this_local;
  
  local_a8 = this;
  peVar5 = std::
           __shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138c67);
  pOVar6 = UserDefinedOperator::GetDefinition(peVar5);
  iVar4 = OperatorDefinition::GetNumOperands(pOVar6);
  lVar2 = -((long)iVar4 * 4 + 0xfU & 0xfffffffffffffff0);
  psVar7 = (pointer)((long)&local_128 + lVar2);
  operands.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar7;
  *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138c9b;
  peVar5 = std::
           __shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(*(__shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          **)(&stack0xfffffffffffffed0 + lVar2));
  p_Var1 = (peVar5->super_Operator)._vptr_Operator[1];
  *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138ca8;
  (*p_Var1)(&i);
  local_40 = 0;
  while( true ) {
    local_b0 = local_40;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138cc4;
    sVar8 = std::
            vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
            ::size((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                    *)&i);
    __n = local_40;
    if (sVar8 <= local_b0) break;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138ce0;
    std::
    vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
    ::operator[]((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                  *)&i,__n);
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138cef;
    local_b4 = ProcessOperator(*(Visitor<__int128> **)((long)&local_118 + lVar2 + 8),
                               *(shared_ptr<const_calc4::Operator> **)((long)&local_118 + lVar2));
    *(int *)((long)&((operands.
                      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
            local_40 * 4) = local_b4;
    local_40 = local_40 + 1;
  }
  *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138d39;
  peVar5 = std::
           __shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(*(__shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          **)(&stack0xfffffffffffffed0 + lVar2));
  *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138d41;
  local_4e = (_Optional_payload_base<bool>)UserDefinedOperator::IsTailCall(peVar5);
  local_4f = 0;
  *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138d56;
  bVar3 = std::optional<bool>::value_or<bool>
                    (*(optional<bool> **)((long)&local_118 + lVar2),
                     *(bool **)((long)&local_128 + lVar2 + 8));
  local_b5 = false;
  if (bVar3) {
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138d70;
    peVar5 = std::
             __shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(*(__shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            **)(&stack0xfffffffffffffed0 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138d78;
    UserDefinedOperator::GetDefinition(peVar5);
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138d8b;
    local_b5 = OperatorDefinition::operator==
                         (*(OperatorDefinition **)((long)&local_118 + lVar2 + 8),
                          *(OperatorDefinition **)((long)&local_118 + lVar2));
  }
  if (local_b5 == false) {
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f4f;
    AppendVariableDeclarationBegin(*(Visitor<__int128> **)((long)&local_100 + lVar2));
    local_118._M_str = (char *)local_a8->os;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f6c;
    peVar5 = std::
             __shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(*(__shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            **)(&stack0xfffffffffffffed0 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f74;
    pOVar6 = UserDefinedOperator::GetDefinition(peVar5);
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f80;
    UserDefinedOperatorName::UserDefinedOperatorName((UserDefinedOperatorName *)&i_2,pOVar6);
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f92;
    poVar10 = anon_unknown_0::operator<<
                        (*(ostream **)((long)&local_128 + lVar2 + 8),
                         (UserDefinedOperatorName *)
                         (psVar7->
                         super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    local_118._M_len = (size_t)poVar10;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138fac;
    std::operator<<(poVar10,'(');
    local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    while( true ) {
      local_128.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_90;
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138fd0;
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                std::
                vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                ::size((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                        *)&i);
      if (p_Var11 <=
          local_128.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi) break;
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        poVar10 = local_a8->os;
        *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x139004;
        std::operator<<(poVar10,", ");
      }
      local_128.super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_a8->os;
      iVar4 = *(int *)((long)&((operands.
                                super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr + (long)local_90 * 4);
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x139034;
      VariableName::VariableName(&local_94,iVar4);
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x139048;
      anon_unknown_0::operator<<
                ((ostream *)
                 (psVar7->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,(VariableName)*(int *)((long)&local_128 + lVar2 + 0xc));
      local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&local_90->_vptr__Sp_counted_base + 1);
    }
    poVar10 = local_a8->os;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x139078;
    std::operator<<(poVar10,')');
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x139086;
    AppendVariableDeclarationEnd(*(Visitor<__int128> **)(&stack0xfffffffffffffed0 + lVar2));
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x139094;
    std::optional<int>::optional(&local_9c);
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x1390a7;
    Return(*(Visitor<__int128> **)((long)&local_118 + lVar2),
           (_Optional_base<int,_true,_true>)
           ((_Optional_base<int,_true,_true> *)((long)&local_118 + lVar2 + 8))->_M_payload);
  }
  else {
    local_54 = 0;
    while( true ) {
      local_bc = local_54;
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138db9;
      sVar8 = std::
              vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
              ::size((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                      *)&i);
      if ((int)sVar8 <= local_bc) break;
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138dd6;
      local_c8 = Append(*(Visitor<__int128> **)((long)&local_118 + lVar2 + 8));
      iVar4 = local_54;
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138deb;
      ArgumentName::ArgumentName(&local_58,iVar4);
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138dfc;
      poVar10 = anon_unknown_0::operator<<
                          ((ostream *)
                           (psVar7->
                           super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,(ArgumentName)*(int *)((long)&local_128 + lVar2 + 0xc));
      local_d0 = poVar10;
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138e18;
      local_d8 = std::operator<<(poVar10," = ");
      iVar4 = *(int *)((long)&((operands.
                                super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)
                              ._M_ptr + (long)local_54 * 4);
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138e35;
      VariableName::VariableName(&local_5c,iVar4);
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138e46;
      poVar10 = anon_unknown_0::operator<<
                          ((ostream *)
                           (psVar7->
                           super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,(VariableName)*(int *)((long)&local_128 + lVar2 + 0xc));
      local_e0 = poVar10;
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138e60;
      poVar10 = std::operator<<(poVar10,';');
      local_e8 = poVar10;
      *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138e7c;
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      local_54 = local_54 + 1;
    }
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138e9a;
    poVar10 = Append(*(Visitor<__int128> **)((long)&local_118 + lVar2 + 8));
    local_f0 = poVar10;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138eb6;
    local_f8 = std::operator<<(poVar10,"goto ");
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138ec4;
    local_70 = OperatorEntryLabel();
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138ee0;
    pbVar9 = std::operator<<(*(basic_ostream<char,_std::char_traits<char>_> **)
                              ((long)&local_128 + lVar2 + 8),
                             *(basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)&local_118 + lVar2));
    local_100 = pbVar9;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138efa;
    poVar10 = std::operator<<(pbVar9,';');
    local_108 = poVar10;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f16;
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    local_7c = 0xffffffff;
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f2c;
    std::optional<int>::optional<int,_true>
              (*(optional<int> **)((long)&local_128 + lVar2 + 8),
               (int *)(psVar7->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr);
    *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x138f3c;
    Return(*(Visitor<__int128> **)((long)&local_118 + lVar2),
           (_Optional_base<int,_true,_true>)
           ((_Optional_base<int,_true,_true> *)((long)&local_118 + lVar2 + 8))->_M_payload);
  }
  *(undefined8 *)(&stack0xfffffffffffffed0 + lVar2) = 0x1390b4;
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(*(vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
              **)((long)&local_118 + lVar2 + 8));
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        int* operandVariableNos =
            reinterpret_cast<int*>(alloca(sizeof(int) * op->GetDefinition().GetNumOperands()));

        auto operands = op->GetOperands();
        for (size_t i = 0; i < operands.size(); i++)
        {
            operandVariableNos[i] = ProcessOperator(operands[i]);
        }

        if (op->IsTailCall().value_or(false) && op->GetDefinition() == this->definition)
        {
            for (int i = 0; i < static_cast<int>(operands.size()); i++)
            {
                Append() << ArgumentName(i) << " = " << VariableName(operandVariableNos[i]) << ';'
                         << std::endl;
            }

            Append() << "goto " << OperatorEntryLabel() << ';' << std::endl;
            Return(-1);
        }
        else
        {
            AppendVariableDeclarationBegin();
            os << UserDefinedOperatorName(op->GetDefinition()) << '(';
            for (size_t i = 0; i < operands.size(); i++)
            {
                if (i > 0)
                {
                    os << ", ";
                }

                os << VariableName(operandVariableNos[i]);
            }
            os << ')';
            AppendVariableDeclarationEnd();
            Return();
        }
    }